

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_rEr.cpp
# Opt level: O3

vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_> *
DronePoseLib::ValtonenOrnhagArxiv2021Extra::get_rEr
          (vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>
           *__return_storage_ptr__,MatrixXd *p1,MatrixXd *p2,Matrix3d *R1,Matrix3d *R2,
          double focal_length)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Matrix<double,_22,_1,_0,_22,_1> *pMVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Index innerSize;
  long lVar14;
  CommaInitializer<Eigen::Matrix<double,_22,_1,_0,_22,_1>_> *pCVar15;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar16;
  evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> eVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  char *__file;
  ulong uVar21;
  char *__assertion;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_> *output;
  MatrixXd pp2;
  MatrixXd pp1;
  Vector3d kinv;
  SrcEvaluatorType srcEvaluator;
  Matrix<double,_3,_1,_0,_3,_1> workspace;
  RelPose relpose;
  Matrix<double,_5,_1,_0,_5,_1> coeffs;
  Matrix3d Q;
  Matrix3d skew_t;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> qr;
  Matrix3d R;
  Vector4cd r;
  Matrix<double,_22,_1,_0,_22,_1> x;
  DenseStorage<double,__1,__1,__1,_0> local_4f8;
  double local_4e0;
  undefined1 local_4d8 [16];
  DenseStorage<double,__1,__1,__1,_0> local_4c0;
  Matrix<double,_22,_1,_0,_22,_1> *local_4a8;
  double dStack_4a0;
  undefined1 *local_498;
  double local_490;
  Scalar local_488;
  diagonal_product_evaluator_base<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Product<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::DiagonalMatrix<double,_3,_3>,_1>,_2>
  local_480;
  Matrix<double,_22,_1,_0,_22,_1> *local_428;
  double dStack_420;
  undefined1 *local_418;
  Scalar local_410;
  double local_408;
  double local_400;
  Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_3f8;
  Matrix<double,_3,_1,_0,_3,_1> local_3d0;
  double dStack_3b8;
  value_type local_3b0;
  Matrix<double,_5,_1,_0,_5,_1> local_340;
  undefined8 local_318;
  Matrix<double,_3,_3,_0,_3,_3> local_310;
  undefined1 local_2c8 [16];
  Matrix<double,_3,_3,_0,_3,_3> local_2b0;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_268;
  undefined1 local_170 [48];
  undefined1 local_140 [24];
  undefined1 local_128 [8];
  double dStack_120;
  undefined1 *local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  Matrix<double,_22,_1,_0,_22,_1> local_e8;
  
  local_4e0 = focal_length;
  if ((p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows != 2)
  {
    __assert_fail("p1.rows() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/rEr/get_rEr.cpp"
                  ,0x2e,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021Extra::get_rEr(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &, double)"
                 );
  }
  if ((p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows != 2)
  {
    __assertion = "p2.rows() == 2";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/rEr/get_rEr.cpp"
    ;
    pcVar18 = 
    "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021Extra::get_rEr(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &, double)"
    ;
LAB_00174624:
    __assert_fail(__assertion,__file,0x2f,pcVar18);
  }
  if ((p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 3)
  {
    __assert_fail("p1.cols() == nbr_pts",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/rEr/get_rEr.cpp"
                  ,0x30,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021Extra::get_rEr(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &, double)"
                 );
  }
  if ((p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 3)
  {
    __assert_fail("p2.cols() == nbr_pts",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/rEr/get_rEr.cpp"
                  ,0x31,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021Extra::get_rEr(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &, double)"
                 );
  }
  local_428 = (Matrix<double,_22,_1,_0,_22,_1> *)normalize2dpts(p1);
  dVar7 = normalize2dpts(p2);
  local_4d8._8_4_ = extraout_XMM0_Dc;
  local_4d8._0_8_ = dVar7;
  local_4d8._12_4_ = extraout_XMM0_Dd;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_4c0,(DenseStorage<double,__1,__1,__1,_0> *)p1);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_4f8,(DenseStorage<double,__1,__1,__1,_0> *)p2);
  if ((local_4c0.m_cols | local_4c0.m_rows) < 0) {
LAB_0017457c:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if (local_4d8._0_8_ <= (double)local_428) {
    local_4d8._0_4_ = SUB84(local_428,0);
    local_4d8._4_4_ = (undefined4)((ulong)local_428 >> 0x20);
  }
  lVar14 = local_4c0.m_cols * local_4c0.m_rows;
  uVar19 = lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar14) {
    lVar20 = 0;
    do {
      dVar7 = (local_4c0.m_data + lVar20)[1];
      local_4c0.m_data[lVar20] = local_4c0.m_data[lVar20] * (double)local_4d8._0_8_;
      (local_4c0.m_data + lVar20)[1] = dVar7 * (double)local_4d8._0_8_;
      lVar20 = lVar20 + 2;
    } while (lVar20 < (long)uVar19);
  }
  if ((long)uVar19 < lVar14) {
    do {
      local_4c0.m_data[uVar19] = local_4c0.m_data[uVar19] * (double)local_4d8._0_8_;
      uVar19 = uVar19 + 1;
    } while (lVar14 - uVar19 != 0);
  }
  if ((local_4f8.m_cols | local_4f8.m_rows) < 0) goto LAB_0017457c;
  lVar14 = local_4f8.m_cols * local_4f8.m_rows;
  uVar19 = lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar14) {
    lVar20 = 0;
    do {
      pMVar6 = (Matrix<double,_22,_1,_0,_22,_1> *)(local_4f8.m_data + lVar20)[1];
      local_4f8.m_data[lVar20] =
           (double)((double)local_4f8.m_data[lVar20] * (double)local_4d8._0_8_);
      (local_4f8.m_data + lVar20)[1] = (double)((double)pMVar6 * (double)local_4d8._0_8_);
      lVar20 = lVar20 + 2;
    } while (lVar20 < (long)uVar19);
  }
  if ((long)uVar19 < lVar14) {
    do {
      local_4f8.m_data[uVar19] =
           (double)((double)local_4f8.m_data[uVar19] * (double)local_4d8._0_8_);
      uVar19 = uVar19 + 1;
    } while (lVar14 - uVar19 != 0);
  }
  local_4e0 = local_4e0 * (double)local_4d8._0_8_;
  dVar8 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [0];
  dVar9 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [1];
  dVar10 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [3];
  dVar11 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [4];
  dVar12 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [6];
  dVar13 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [7];
  dVar7 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  dVar1 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [5];
  dVar2 = (R2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8];
  lVar14 = 2;
  do {
    dVar3 = *(double *)R1;
    dVar4 = *(double *)((long)R1 + 0x18);
    dVar5 = *(double *)((long)R1 + 0x30);
    *(double *)((long)(&local_268.m_colNormsDirect + 2) + lVar14 * 8) =
         dVar5 * dVar12 + dVar4 * dVar10 + dVar3 * dVar8;
    *(double *)((long)(&local_268.m_colNormsDirect + 2) + (lVar14 + 1) * 8) =
         dVar5 * dVar13 + dVar4 * dVar11 + dVar3 * dVar9;
    *(double *)(local_170 + lVar14 * 8) = dVar5 * dVar2 + dVar1 * dVar4 + dVar3 * dVar7;
    lVar14 = lVar14 + 3;
    R1 = (Matrix3d *)((long)R1 + 8);
  } while (lVar14 != 0xb);
  if (-1 < local_4c0.m_rows || local_4c0.m_data == (double *)0x0) {
    if (local_4c0.m_cols < 1) goto LAB_0017453e;
    local_4a8 = &local_e8;
    dStack_4a0 = 0.0;
    local_498 = (undefined1 *)0x1;
    local_490 = (double)local_4c0.m_rows;
    if (0x16 < local_4c0.m_rows) {
      __assertion = 
      "m_xpr.rows() >= other.rows() && m_xpr.cols() >= other.cols() && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
      ;
      __file = "/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h";
      pcVar18 = 
      "Eigen::CommaInitializer<Eigen::Matrix<double, 22, 1>>::CommaInitializer(XprType &, const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, 22, 1>, OtherDerived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>]"
      ;
      goto LAB_00174624;
    }
    if (local_4c0.m_rows < 0) {
      pcVar18 = 
      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, 22, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 22, 1>>, Level = 0]"
      ;
      goto LAB_00174572;
    }
    uVar19 = local_4c0.m_rows & 0x7ffffffffffffffe;
    if (uVar19 != 0) {
      uVar21 = 0;
      do {
        dVar7 = (local_4c0.m_data + uVar21)[1];
        local_e8.super_PlainObjectBase<Eigen::Matrix<double,_22,_1,_0,_22,_1>_>.m_storage.m_data.
        array[uVar21] = local_4c0.m_data[uVar21];
        local_e8.super_PlainObjectBase<Eigen::Matrix<double,_22,_1,_0,_22,_1>_>.m_storage.m_data.
        array[uVar21 + 1] = dVar7;
        uVar21 = uVar21 + 2;
      } while (uVar21 < uVar19);
    }
    for (; (long)uVar19 < local_4c0.m_rows; uVar19 = uVar19 + 1) {
      local_e8.super_PlainObjectBase<Eigen::Matrix<double,_22,_1,_0,_22,_1>_>.m_storage.m_data.array
      [uVar19] = local_4c0.m_data[uVar19];
    }
    local_268.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
    array[0] = (double)(local_4c0.m_data + local_4c0.m_rows);
    local_268.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
    array[1] = (double)local_4c0.m_rows;
    local_268.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
    array[4] = 0.0;
    local_268.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
    array[5] = 4.94065645841247e-324;
    local_268.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
    array[6] = (double)local_4c0.m_rows;
    local_268.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
    array[3] = (double)&local_4c0;
    if (local_4c0.m_cols == 1) goto LAB_0017453e;
    pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)&local_4a8,
                         (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                          *)&local_268);
    local_3b0.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = (double)(local_4c0.m_data + local_4c0.m_rows * 2);
    local_3b0.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [1] = (double)local_4c0.m_rows;
    if (-1 < local_4c0.m_rows || local_4c0.m_data == (double *)0x0) {
      local_3b0.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[4] = 0.0;
      local_3b0.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[5] = 9.88131291682493e-324;
      local_3b0.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[6] = (double)local_4c0.m_rows;
      local_3b0.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[3] = (double)&local_4c0;
      if (local_4c0.m_cols < 3) goto LAB_0017453e;
      pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar15,
                           (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                            *)&local_3b0);
      local_480.m_diagImpl.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.data =
           (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)
           (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)
           local_4f8.m_data;
      local_480.m_matImpl.
      super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.data =
           (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
           (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
           local_4f8.m_rows;
      if (-1 < local_4f8.m_rows ||
          (Matrix<double,_22,_1,_0,_22,_1> **)local_4f8.m_data ==
          (Matrix<double,_22,_1,_0,_22,_1> **)0x0) {
        local_480.m_matImpl.
        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = 0.0;
        local_480.m_matImpl.
        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = 0.0;
        local_480.m_matImpl.
        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = (double)local_4f8.m_rows;
        local_480.m_matImpl.
        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = (double)&local_4f8;
        if (local_4f8.m_cols < 1) goto LAB_0017453e;
        pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                            ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar15,
                             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                              *)&local_480);
        local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)(local_4f8.m_data + local_4f8.m_rows);
        local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = (double)local_4f8.m_rows;
        if (-1 < local_4f8.m_rows ||
            (Matrix<double,_22,_1,_0,_22,_1> **)local_4f8.m_data ==
            (Matrix<double,_22,_1,_0,_22,_1> **)0x0) {
          local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[4] = 0.0;
          local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5] = 4.94065645841247e-324;
          local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6] = (double)local_4f8.m_rows;
          local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] = (double)&local_4f8;
          if (local_4f8.m_cols < 2) {
LAB_0017453e:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                          "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                         );
          }
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar15,
                               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                                *)&local_310);
          local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = (double)(local_4f8.m_data + local_4f8.m_rows * 2);
          local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] = (double)local_4f8.m_rows;
          if (-1 < local_4f8.m_rows ||
              (Matrix<double,_22,_1,_0,_22,_1> **)local_4f8.m_data ==
              (Matrix<double,_22,_1,_0,_22,_1> **)0x0) {
            local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] = 0.0;
            local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] = 9.88131291682493e-324;
            local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] = (double)local_4f8.m_rows;
            local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] = (double)&local_4f8;
            if (2 < local_4f8.m_cols) {
              pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                                  ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar15,
                                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                                    *)&local_2b0);
              local_110 = 0;
              uStack_108 = 0;
              local_100 = 3;
              local_128 = (undefined1  [8])local_170;
              local_118 = local_170;
              pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                                  ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar15,
                                   (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                                    *)local_128);
              local_3f8.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
                   = (double)(local_170 + 0x18);
              local_3f8.m_lhs.m_rhs = (RhsNested)0x0;
              local_3f8.m_rhs = (RhsNested)0x1;
              local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] = 1.48219693752374e-323;
              local_3f8.m_lhs.m_lhs.m_diagonal.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
                   = (double)local_170;
              pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                                  ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar15,
                                   (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                                    *)&local_3f8);
              local_340.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
              m_data.array[0] = (double)(local_170 + 0x30);
              local_340.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
              m_data.array[3] = 0.0;
              local_340.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
              m_data.array[4] = 9.88131291682493e-324;
              local_318 = 3;
              local_340.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
              m_data.array[2] = (double)local_170;
              pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                                  ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar15,
                                   (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                                    *)&local_340);
              Eigen::CommaInitializer<Eigen::Matrix<double,_22,_1,_0,_22,_1>_>::operator_
                        (pCVar15,&local_4e0);
              if (((long)local_490 + (long)dStack_4a0 != 0x16) || (local_498 != (undefined1 *)0x1))
              {
                pcVar18 = 
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 22, 1>>::finished() [MatrixType = Eigen::Matrix<double, 22, 1>]"
                ;
LAB_00174692:
                __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                              ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar18)
                ;
              }
              calculate_coefficients(&local_340,&local_e8);
              solve_quartic((Vector4cd *)local_128,
                            local_340.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                            m_storage.m_data.array[1] /
                            local_340.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                            m_storage.m_data.array[0],
                            local_340.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                            m_storage.m_data.array[2] /
                            local_340.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                            m_storage.m_data.array[0],
                            local_340.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                            m_storage.m_data.array[3] /
                            local_340.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                            m_storage.m_data.array[0],
                            local_340.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                            m_storage.m_data.array[4] /
                            local_340.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                            m_storage.m_data.array[0]);
              (__return_storage_ptr__->
              super__Vector_base<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_2c8._8_4_ = local_4d8._8_4_;
              local_2c8._0_8_ = local_4d8._0_8_ * local_4d8._0_8_;
              local_2c8._12_4_ = local_4d8._12_4_;
              lVar14 = 0;
              do {
                if (ABS((&dStack_120)[lVar14 * 2]) < 1e-12) {
                  create_M((Matrix3d *)&local_268,*(double *)(local_128 + lVar14 * 0x10),&local_e8);
                  local_268.m_isInitialized = false;
                  local_268.m_usePrescribedThreshold = false;
                  Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::computeInPlace
                            (&local_268);
                  if (local_268.m_isInitialized == false) {
                    __assert_fail("m_isInitialized && \"ColPivHouseholderQR is not initialized.\"",
                                  "/usr/include/eigen3/Eigen/src/QR/ColPivHouseholderQR.h",0x291,
                                  "typename ColPivHouseholderQR<MatrixType>::HouseholderSequenceType Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, 3, 1, 3, 3>>::householderQ() const [MatrixType = Eigen::Matrix<double, 3, 3, 1, 3, 3>]"
                                 );
                  }
                  local_480.m_diagImpl.
                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.
                  m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              )&local_268;
                  local_480.m_matImpl.
                  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.
                  m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                              )&local_268.m_hCoeffs;
                  local_480.m_matImpl.
                  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0] =
                       (double)((ulong)local_480.m_matImpl.
                                       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                       .m_result.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                       m_storage.m_data.array[0] & 0xffffffffffffff00);
                  local_480.m_matImpl.
                  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1] = 1.48219693752374e-323;
                  local_480.m_matImpl.
                  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[2] = 0.0;
                  Eigen::
                  HouseholderSequence<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,1,0,3,1>,1>
                  ::evalTo<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>>
                            ((HouseholderSequence<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,1,0,3,1>,1>
                              *)&local_480,&local_310,(Matrix<double,_3,_1,_0,_3,_1> *)&local_3f8);
                  local_3b0.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                  .m_data.array[0] =
                       local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[6];
                  local_3b0.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                  .m_data.array[1] =
                       local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[7];
                  local_3b0.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                  .m_data.array[2] =
                       local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[8];
                  local_3b0.f = local_4e0 / (double)local_4d8._0_8_;
                  local_3b0.r = *(double *)(local_128 + lVar14 * 0x10) * (double)local_2c8._0_8_;
                  local_4a8 = (Matrix<double,_22,_1,_0,_22,_1> *)(1.0 / local_3b0.f);
                  local_480.m_diagImpl.
                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.
                  m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              )&local_4a8;
                  local_480.m_matImpl.
                  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.
                  m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                              )(plainobjectbase_evaluator_data<double,_3>)0x0;
                  local_480.m_matImpl.
                  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0] = 4.94065645841247e-324;
                  local_480.m_matImpl.
                  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1] = 4.94065645841247e-324;
                  local_3f8.m_lhs.m_lhs.m_diagonal.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[0] = (double)local_4a8;
                  this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                                   ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                    &local_480,(Scalar *)&local_3f8);
                  local_488 = 1.0;
                  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                            (this,&local_488);
                  if (((long)(double **)
                             local_480.m_matImpl.
                             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[1] +
                       (long)local_480.m_matImpl.
                             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                             .m_d.data != 3) ||
                     (local_480.m_matImpl.
                      super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                      .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[0] != 4.94065645841247e-324)) {
                    pcVar18 = 
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
                    ;
                    goto LAB_00174692;
                  }
                  local_428 = local_4a8;
                  dStack_420 = dStack_4a0;
                  local_418 = local_498;
                  local_480.m_matImpl.
                  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.
                  m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                              )(plainobjectbase_evaluator_data<double,_3>)0x0;
                  local_480.m_matImpl.
                  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0] = 4.94065645841247e-324;
                  local_480.m_matImpl.
                  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1] = 4.94065645841247e-324;
                  local_2b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0] = 0.0;
                  local_3f8.m_lhs.m_lhs.m_diagonal.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[0] = (double)((ulong)local_3b0.t.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                             .m_storage.m_data.array[2] ^ 0x8000000000000000);
                  local_480.m_diagImpl.
                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.
                  m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              )(evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                )&local_2b0;
                  pCVar16 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::
                            operator_((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                      &local_480,(Scalar *)&local_3f8);
                  pCVar16 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::
                            operator_(pCVar16,(double *)
                                              ((long)local_3b0.t.
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                                  .m_storage.m_data.array + 8));
                  pCVar16 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::
                            operator_(pCVar16,(double *)
                                              ((long)local_3b0.t.
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                                  .m_storage.m_data.array + 0x10));
                  local_488 = 0.0;
                  pCVar16 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::
                            operator_(pCVar16,&local_488);
                  local_400 = -local_3b0.t.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[0];
                  pCVar16 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::
                            operator_(pCVar16,&local_400);
                  local_408 = -local_3b0.t.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[1];
                  pCVar16 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::
                            operator_(pCVar16,&local_408);
                  pCVar16 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::
                            operator_(pCVar16,(Scalar *)&local_3b0.t);
                  local_410 = 0.0;
                  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                            (pCVar16,&local_410);
                  if (((long)(double **)
                             local_480.m_matImpl.
                             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[1] +
                       (long)local_480.m_matImpl.
                             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                             .m_d.data != 3) ||
                     (local_480.m_matImpl.
                      super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                      .m_result.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[0] != 1.48219693752374e-323)) {
                    pcVar18 = 
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
                    ;
                    goto LAB_00174692;
                  }
                  local_3f8.m_lhs.m_lhs.m_diagonal.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[0] = (double)local_428;
                  local_3f8.m_lhs.m_lhs.m_diagonal.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[1] = dStack_420;
                  local_3f8.m_lhs.m_lhs.m_diagonal.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2] = (double)local_418;
                  local_3f8.m_rhs = (RhsNested)local_170;
                  local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0] = (double)local_428;
                  local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1] = dStack_420;
                  local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2] = (double)local_418;
                  local_3f8.m_lhs.m_rhs = &local_2b0;
                  Eigen::internal::
                  diagonal_product_evaluator_base<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Product<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::DiagonalMatrix<double,_3,_3>,_1>,_2>
                  ::diagonal_product_evaluator_base(&local_480,&local_3f8,&local_3d0);
                  lVar20 = 2;
                  eVar17.
                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.
                  m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              )(evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                )local_480.m_diagImpl;
                  do {
                    dVar7 = ((double *)
                            ((long)local_480.m_matImpl.
                                   super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                   .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                   .m_d.data + (lVar20 + -2) * 8))[1];
                    pMVar6 = *(Matrix<double,_22,_1,_0,_22,_1> **)
                              eVar17.
                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              .m_d.data;
                    local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array[lVar20 + 2] =
                         (double)pMVar6 *
                         *(double *)
                          ((long)local_480.m_matImpl.
                                 super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                 .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                 .m_d.data + (lVar20 + -2) * 8);
                    (&dStack_3b8)[lVar20] = (double)pMVar6 * dVar7;
                    local_3b0.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[lVar20] =
                         *(double *)
                          ((long)local_480.m_matImpl.
                                 super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                 .super_evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                 .m_d.data + lVar20 * 8) *
                         (double)*(Matrix<double,_22,_1,_0,_22,_1> **)
                                  eVar17.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  .m_d.data;
                    lVar20 = lVar20 + 3;
                    eVar17.
                    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.
                    m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                )((long)eVar17.
                                        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                        .m_d.data + 8);
                  } while (lVar20 != 0xb);
                  std::vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>::
                  push_back(__return_storage_ptr__,&local_3b0);
                }
                lVar14 = lVar14 + 1;
                if (lVar14 == 4) {
                  free(local_4f8.m_data);
                  free(local_4c0.m_data);
                  return __return_storage_ptr__;
                }
              } while( true );
            }
            goto LAB_0017453e;
          }
        }
      }
    }
  }
  pcVar18 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
  ;
LAB_00174572:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar18);
}

Assistant:

std::vector<RelPose> get_rEr(
        const Eigen::MatrixXd &p1,
        const Eigen::MatrixXd &p2,
        const Eigen::Matrix3d &R1,
        const Eigen::Matrix3d &R2,
        double focal_length
    ) {
        // This is a 3-point method
        int nbr_pts = 3;

        // We expect inhomogenous input data, i.e. p1 and p2 are 2x3 matrices
        assert(p1.rows() == 2);
        assert(p2.rows() == 2);
        assert(p1.cols() == nbr_pts);
        assert(p2.cols() == nbr_pts);

        // Compute normalization matrix
        double scale1 = normalize2dpts(p1);
        double scale2 = normalize2dpts(p2);
        double scale = std::max(scale1, scale2);

        // Make a copy
        Eigen::MatrixXd pp1 = p1;
        Eigen::MatrixXd pp2 = p2;
        pp1 *= scale;
        pp2 *= scale;
        focal_length *= scale;

        // Compute relative rotation
        Eigen::Matrix3d R = R2 * R1.transpose();

        Eigen::Matrix<double, 22, 1> x;
        x << pp1.col(0), pp1.col(1), pp1.col(2),
             pp2.col(0), pp2.col(1), pp2.col(2),
             R.col(0), R.col(1), R.col(2), focal_length;

        Eigen::Matrix<double, 5, 1> coeffs = calculate_coefficients(x);

        Eigen::Vector4cd r  = solve_quartic(
            coeffs(1) / coeffs(0),
            coeffs(2) / coeffs(0),
            coeffs(3) / coeffs(0),
            coeffs(4) / coeffs(0));

        // Construct putative output
        double thresh = 1e-12;
        Eigen::Matrix3d M;
        std::vector<RelPose> output;
        RelPose relpose;
        Eigen::Matrix3d Q;
        Eigen::Vector3d kinv;
        Eigen::DiagonalMatrix<double, 3> Kinv;
        Eigen::Matrix3d skew_t;

        // Householder is just 500 ns slower than null3, but is significantly more stable
        for (int i=0; i < r.size(); i++) {
            if (std::abs(std::imag(r[i])) < thresh) {
                M = create_M(std::real(r[i]), x);
                auto qr = M.transpose().colPivHouseholderQr();
                Q = qr.householderQ();
                relpose.t = Q.col(2);
                relpose.f = focal_length / scale;
                relpose.r = std::real(r[i]) * std::pow(scale, 2);

                // Compute fundamental matrix
                kinv << 1.0 / relpose.f, 1.0 / relpose.f, 1.0;
                Kinv = kinv.asDiagonal();
                skew_t << 0, -relpose.t(2), relpose.t(1),
                          relpose.t(2), 0, -relpose.t(0),
                         -relpose.t(1), relpose.t(0), 0;
                relpose.F = Kinv * skew_t * R * Kinv;

                output.push_back(relpose);
            }
        }

        return output;
    }